

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

void S2Builder::Graph::CanonicalizeLoopOrder
               (vector<int,_std::allocator<int>_> *min_input_ids,
               vector<int,_std::allocator<int>_> *loop)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  size_type sVar8;
  iterator __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_28;
  int local_24;
  int cmp;
  int i;
  bool saw_gap;
  vector<int,_std::allocator<int>_> *pvStack_18;
  int pos;
  vector<int,_std::allocator<int>_> *loop_local;
  vector<int,_std::allocator<int>_> *min_input_ids_local;
  
  pvStack_18 = loop;
  loop_local = min_input_ids;
  bVar3 = std::vector<int,_std::allocator<int>_>::empty(loop);
  if (!bVar3) {
    i = 0;
    cmp._3_1_ = 0;
    for (local_24 = 1; uVar4 = (ulong)local_24,
        sVar5 = std::vector<int,_std::allocator<int>_>::size(pvStack_18), pvVar2 = loop_local,
        uVar4 < sVar5; local_24 = local_24 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_18,(long)local_24);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)*pvVar6);
      pvVar2 = loop_local;
      iVar1 = *pvVar7;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_18,(long)i);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)*pvVar6);
      local_28 = iVar1 - *pvVar7;
      if (local_28 < 0) {
        cmp._3_1_ = 1;
      }
      else if ((0 < local_28) || ((cmp._3_1_ & 1) == 0)) {
        i = local_24;
        cmp._3_1_ = 0;
      }
    }
    i = i + 1;
    sVar5 = (size_type)i;
    sVar8 = std::vector<int,_std::allocator<int>_>::size(pvStack_18);
    if (sVar5 == sVar8) {
      i = 0;
    }
    local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvStack_18);
    local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvStack_18);
    local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_40,(long)i);
    __last = std::vector<int,_std::allocator<int>_>::end(pvStack_18);
    std::_V2::rotate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_30,local_38,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current)
    ;
  }
  return;
}

Assistant:

void Graph::CanonicalizeLoopOrder(const vector<InputEdgeId>& min_input_ids,
                                  vector<EdgeId>* loop) {
  if (loop->empty()) return;
  // Find the position of the element with the highest input edge id.  If
  // there are multiple such elements together (i.e., the edge was split
  // into several pieces by snapping it to several vertices), then we choose
  // the last such position in cyclic order (this attempts to preserve the
  // original loop order even when new vertices are added).  For example, if
  // the input edge id sequence is (7, 7, 4, 5, 6, 7) then we would rotate
  // it to obtain (4, 5, 6, 7, 7, 7).

  // The reason that we put the highest-numbered edge last, rather than the
  // lowest-numbered edge first, is that S2Loop::Invert() reverses the loop
  // edge order *except* for the last edge.  For example, the loop ABCD (with
  // edges AB, BC, CD, DA) becomes DCBA (with edges DC, CB, BA, AD).  Note
  // that the last edge is the same except for its direction (DA vs. AD).
  // This has the advantage that if an undirected loop is assembled with the
  // wrong orientation and later inverted (e.g. by S2Polygon::InitOriented),
  // we still end up preserving the original cyclic vertex order.
  int pos = 0;
  bool saw_gap = false;
  for (int i = 1; i < loop->size(); ++i) {
    int cmp = min_input_ids[(*loop)[i]] - min_input_ids[(*loop)[pos]];
    if (cmp < 0) {
      saw_gap = true;
    } else if (cmp > 0 || !saw_gap) {
      pos = i;
      saw_gap = false;
    }
  }
  if (++pos == loop->size()) pos = 0;  // Convert loop end to loop start.
  std::rotate(loop->begin(), loop->begin() + pos, loop->end());
}